

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pools.cpp
# Opt level: O3

IStrategy * __thiscall xmrig::Pools::createStrategy(Pools *this,IStrategyListener *listener)

{
  pointer pPVar1;
  bool bVar2;
  FailoverStrategy *this_00;
  SinglePoolStrategy *this_01;
  pointer pPVar3;
  long lVar4;
  Pool *pool_1;
  Pool *pool;
  
  pPVar3 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar3 != pPVar1) {
    lVar4 = 0;
    do {
      bVar2 = Pool::isEnabled(pPVar3);
      lVar4 = lVar4 + (ulong)bVar2;
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar1);
    if (lVar4 == 1) {
      pPVar1 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pPVar3 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>.
                    _M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1)
      {
        bVar2 = Pool::isEnabled(pPVar3);
        if (bVar2) {
          this_01 = (SinglePoolStrategy *)operator_new(0x28);
          SinglePoolStrategy::SinglePoolStrategy
                    (this_01,pPVar3,this->m_retryPause,this->m_retries,listener,false);
          return &this_01->super_IStrategy;
        }
      }
    }
  }
  this_00 = (FailoverStrategy *)operator_new(0x48);
  FailoverStrategy::FailoverStrategy(this_00,this->m_retryPause,this->m_retries,listener,false);
  pPVar1 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar3 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl
                .super__Vector_impl_data._M_start; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1) {
    bVar2 = Pool::isEnabled(pPVar3);
    if (bVar2) {
      FailoverStrategy::add(this_00,pPVar3);
    }
  }
  return &this_00->super_IStrategy;
}

Assistant:

xmrig::IStrategy *xmrig::Pools::createStrategy(IStrategyListener *listener) const
{
    if (active() == 1) {
        for (const Pool &pool : m_data) {
            if (pool.isEnabled()) {
                return new SinglePoolStrategy(pool, retryPause(), retries(), listener);
            }
        }
    }

    auto strategy = new FailoverStrategy(retryPause(), retries(), listener);
    for (const Pool &pool : m_data) {
        if (pool.isEnabled()) {
            strategy->add(pool);
        }
    }

    return strategy;
}